

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

size_t __thiscall Memory::Recycler::RescanMark(Recycler *this,DWORD waitTime)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  size_t sVar8;
  AutoFilterExceptionRegion local_30;
  AutoFilterExceptionRegion local_2c;
  AutoFilterExceptionRegion __autoFilterExceptionRegion;
  AutoFilterExceptionRegion __autoFilterExceptionRegion_1;
  
  bVar4 = this->needOOMRescan;
  if ((this->inPartialCollectMode == false) && (bVar3 = DoQueueTrackedObject(this), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x966,"(this->inPartialCollectMode || DoQueueTrackedObject())",
                       "this->inPartialCollectMode || DoQueueTrackedObject()");
    if (!bVar3) goto LAB_0067fe5c;
    *puVar7 = 0;
  }
  AutoFilterExceptionRegion::AutoFilterExceptionRegion(&local_30,ExceptionType_All);
  (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[2])();
  AutoFilterExceptionRegion::~AutoFilterExceptionRegion(&local_30);
  if ((this->collectionState).value != CollectionStateRescanFindRoots) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x973,"(collectionState == CollectionStateRescanFindRoots)",
                       "collectionState == CollectionStateRescanFindRoots");
    if (!bVar3) goto LAB_0067fe5c;
    *puVar7 = 0;
  }
  if ((bVar4 == false) &&
     (((bVar4 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Force,BackgroundFinishMarkPhase),
       waitTime != 0xffffffff || (bVar4)) &&
      (bVar1 = this->backgroundFinishMarkCount,
      uVar5 = RecyclerHeuristic::MaxBackgroundFinishMarkCount(this->recyclerFlagsTable),
      bVar1 < uVar5)))) {
    PrepareBackgroundFindRoots(this);
    bVar4 = StartConcurrent(this,CollectionStateConcurrentFinishMark);
    if (bVar4) {
      this->backgroundFinishMarkCount = this->backgroundFinishMarkCount + '\x01';
      HeapInfoManager::PrepareSweep(&this->autoHeap);
      BVar6 = WaitForConcurrentThread(this,waitTime,WaitReasonNone);
      if (BVar6 == 0) {
        bVar4 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,BackgroundFinishMarkPhase);
        if (bVar4) {
          Output::Print(L"Finish mark timed out\n");
          Output::Flush();
        }
        AutoFilterExceptionRegion::AutoFilterExceptionRegion(&local_2c,ExceptionType_All);
        (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[4])();
        AutoFilterExceptionRegion::~AutoFilterExceptionRegion(&local_2c);
        return 0xffffffffffffffff;
      }
      if ((this->collectionState).value != CollectionStateRescanWait) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                           ,0x98f,"(collectionState == CollectionStateRescanWait)",
                           "collectionState == CollectionStateRescanWait");
        if (!bVar4) {
LAB_0067fe5c:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
      ObservableValue<Memory::CollectionState>::SetValue
                (&this->collectionState,CollectionStateRescanFindRoots);
      return this->backgroundRescanRootBytes;
    }
    RevertPrepareBackgroundFindRoots(this);
  }
  this->backgroundFinishMarkCount = '\0';
  sVar8 = FinishMarkRescan(this,false);
  return sVar8 << 0xc;
}

Assistant:

size_t
Recycler::RescanMark(DWORD waitTime)
{
    bool const onLowMemory = this->NeedOOMRescan();

    // REVIEW: Why are we asserting for DoQueueTrackedObject here?
    // Should we split this into different asserts depending on whether
    // concurrent or partial is enabled?
#if ENABLE_CONCURRENT_GC
#if ENABLE_PARTIAL_GC
    Assert(this->inPartialCollectMode || DoQueueTrackedObject());
#else
    Assert(DoQueueTrackedObject());
#endif
#endif

    {
        // We are about to do a rescan mark, which for consistency requires the runtime to stop any additional mutator threads
        AUTO_NO_EXCEPTION_REGION;
        collectionWrapper->PreRescanMarkCallback();
    }

    // Always called in-thread
    Assert(collectionState == CollectionStateRescanFindRoots);
#if ENABLE_CONCURRENT_GC
    if (!onLowMemory && // Don't do background finish mark if we are low on memory
        // Only do background finish mark if we have a time limit or it is forced
        (CUSTOM_PHASE_FORCE1(GetRecyclerFlagsTable(), Js::BackgroundFinishMarkPhase) || waitTime != INFINITE) &&
        // Don't do background finish mark if we failed to finish mark too many times
        (this->backgroundFinishMarkCount < RecyclerHeuristic::MaxBackgroundFinishMarkCount(this->GetRecyclerFlagsTable())))
    {
        this->PrepareBackgroundFindRoots();
        if (StartConcurrent(CollectionStateConcurrentFinishMark))
        {
            this->backgroundFinishMarkCount++;
            this->PrepareSweep();
            GCETW(GC_RESCANMARKWAIT_START, (this, waitTime));
            const BOOL waited = WaitForConcurrentThread(waitTime, RecyclerWaitReason::RescanMark);
            GCETW(GC_RESCANMARKWAIT_STOP, (this, !waited));
            if (!waited)
            {
                CUSTOM_PHASE_PRINT_TRACE1(GetRecyclerFlagsTable(), Js::BackgroundFinishMarkPhase, _u("Finish mark timed out\n"));

                {
                    // We timed out doing the finish mark, notify the runtime
                    AUTO_NO_EXCEPTION_REGION;
                    collectionWrapper->RescanMarkTimeoutCallback();
                }

                return Recycler::InvalidScanRootBytes;
            }
            Assert(collectionState == CollectionStateRescanWait);
            this->SetCollectionState(CollectionStateRescanFindRoots);
#ifdef RECYCLER_WRITE_WATCH
            if (!CONFIG_FLAG(ForceSoftwareWriteBarrier))
            {
                Assert(autoHeap.GetWriteWatchPageCount() == 0);
            }
#endif
            return this->backgroundRescanRootBytes;
        }
        this->RevertPrepareBackgroundFindRoots();
    }
#endif
#if ENABLE_CONCURRENT_GC
    this->backgroundFinishMarkCount = 0;
#endif
    return FinishMarkRescan(false) * AutoSystemInfo::PageSize;
}